

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

CfgEdge * __thiscall CFG::findEdge(CFG *this,CfgNode *src,CfgNode *dst)

{
  CfgEdge *pCVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  bVar2 = containsNode(this,src);
  if ((bVar2) && (bVar2 = containsNode(this,dst), bVar2)) {
    for (p_Var3 = (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->m_edges)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      pCVar1 = *(CfgEdge **)(p_Var3 + 1);
      if ((pCVar1->m_src == src) && (pCVar1->m_dst == dst)) {
        return pCVar1;
      }
    }
  }
  return (CfgEdge *)0x0;
}

Assistant:

CfgEdge* CFG::findEdge(CfgNode* src, CfgNode* dst) const {
	if (this->containsNode(src) && this->containsNode(dst)) {
		for (CfgEdge* edge : this->edges()) {
			if (edge->source() == src && edge->destination() == dst)
				return edge;
		}
	}

	return 0;
}